

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void update_members_offset(type *type,mir_size_t offset)

{
  long lVar1;
  node_t_conflict pnVar2;
  mir_size_t local_40;
  long local_30;
  decl_t decl;
  node_t_conflict el;
  mir_size_t offset_local;
  type *type_local;
  
  if (((type->mode == TM_STRUCT) || (type->mode == TM_UNION)) &&
     (type->unnamed_anon_struct_union_member_type_p != '\0')) {
    if ((offset == 0xffffffffffffffff) && (type->raw_size != 0xffffffffffffffff)) {
      __assert_fail("offset != MIR_SIZE_MAX || type->raw_size == MIR_SIZE_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x181d,"void update_members_offset(struct type *, mir_size_t)");
    }
    pnVar2 = DLIST_node_t_el(&(((type->u).tag_type)->u).ops,1);
    for (decl = (decl_t)DLIST_node_t_head(&(pnVar2->u).ops); decl != (decl_t)0x0;
        decl = (decl_t)DLIST_node_t_next((node_t_conflict)decl)) {
      if (*(int *)decl == 0x6c) {
        lVar1 = *(long *)&decl->width;
        if (offset == 0xffffffffffffffff) {
          local_30 = 0;
        }
        else {
          local_30 = *(long *)(lVar1 + 0x10) + offset;
        }
        *(long *)(lVar1 + 0x10) = local_30;
        if (*(char *)(*(long *)(lVar1 + 0x40) + 0x1d) != '\0') {
          if (offset == 0xffffffffffffffff) {
            local_40 = 0xffffffffffffffff;
          }
          else {
            local_40 = *(mir_size_t *)(lVar1 + 0x10);
          }
          update_members_offset(*(type **)(lVar1 + 0x40),local_40);
        }
      }
    }
    return;
  }
  __assert_fail("(type->mode == TM_STRUCT || type->mode == TM_UNION) && type->unnamed_anon_struct_union_member_type_p"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x181c,"void update_members_offset(struct type *, mir_size_t)");
}

Assistant:

static void update_members_offset (struct type *type, mir_size_t offset) {
  assert ((type->mode == TM_STRUCT || type->mode == TM_UNION)
          && type->unnamed_anon_struct_union_member_type_p);
  assert (offset != MIR_SIZE_MAX || type->raw_size == MIR_SIZE_MAX);
  for (node_t el = NL_HEAD (NL_EL (type->u.tag_type->u.ops, 1)->u.ops); el != NULL;
       el = NL_NEXT (el))
    if (el->code == N_MEMBER) {
      decl_t decl = el->attr;

      decl->offset = offset == MIR_SIZE_MAX ? 0 : decl->offset + offset;
      if (decl->decl_spec.type->unnamed_anon_struct_union_member_type_p)
        update_members_offset (decl->decl_spec.type,
                               offset == MIR_SIZE_MAX ? offset : decl->offset);
    }
}